

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O3

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
computeFromHessenberg<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *matrixH,Matrix<double,__1,__1,_0,__1,__1> *matrixQ,bool computeU)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  double *pdVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long il;
  long lVar15;
  long lVar16;
  Scalar SVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  Scalar exshift;
  Scalar local_c8;
  uint local_c0;
  uint local_bc;
  double local_b8;
  long local_b0;
  Vector3s local_a8;
  long local_90;
  long local_88;
  Scalar *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
             (ReturnByValue<Eigen::internal::HessenbergDecompositionMatrixHReturnType<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)matrixH);
  lVar7 = *(long *)(this + 0x10);
  if (lVar7 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x30),lVar7,lVar7,1);
  if ((computeU) &&
     ((*(double **)(this + 0x18) !=
       (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      || (*(long *)(this + 0x20) !=
          (matrixQ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows)))) {
    internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),matrixQ,
               (assign_op<double,_double> *)&local_a8);
  }
  local_b0 = *(long *)(this + 0x88);
  if (local_b0 == -1) {
    if (matrixH->m_hess->m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                    ,0xd8,
                    "const MatrixType &Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::packedMatrix() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_b0 = (matrixH->m_hess->m_matrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
               0x28;
  }
  local_c0 = (uint)CONCAT71(in_register_00000009,computeU);
  lVar7 = *(long *)(this + 0x10);
  local_80 = *(Scalar **)(this + 0x30);
  local_c8 = 0.0;
  SVar17 = RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeNormOfT
                     ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  lVar13 = 0;
  if ((0 < lVar7) && ((SVar17 != 0.0 || (NAN(SVar17))))) {
    dVar21 = 2.2250738585072014e-308;
    if (2.2250738585072014e-308 <= SVar17 * 4.930380657631324e-32) {
      dVar21 = SVar17 * 4.930380657631324e-32;
    }
    lVar7 = lVar7 + -1;
    local_bc = local_c0 & 0xff;
    lVar14 = 0;
    lVar13 = 0;
    local_b8 = dVar21;
    do {
      pdVar4 = *(double **)this;
      lVar2 = *(long *)(this + 8);
      lVar15 = lVar7 + -1;
      lVar6 = lVar7 * 8;
      lVar8 = lVar2 * 8 * lVar15 + lVar7 * 8;
      pdVar12 = pdVar4;
      lVar9 = lVar7;
      do {
        lVar16 = lVar9;
        if (lVar16 < 1) {
          il = 0;
          break;
        }
        pdVar1 = (double *)((long)pdVar12 + lVar8);
        dVar20 = (ABS(*(double *)((long)pdVar12 + (lVar2 * 8 + 8) * lVar7)) +
                 ABS(*(double *)((long)pdVar12 + lVar8 + -8))) * 2.220446049250313e-16;
        dVar19 = dVar21;
        if (dVar21 <= dVar20) {
          dVar19 = dVar20;
        }
        pdVar12 = (double *)((long)pdVar12 + (lVar2 * 8 ^ 0xfffffffffffffff8U));
        il = lVar16;
        lVar9 = lVar16 + -1;
      } while (dVar19 < ABS(*pdVar1));
      if (il == lVar7) {
        pdVar4[lVar2 * lVar7 + lVar7] = pdVar4[lVar2 * lVar7 + lVar7] + local_c8;
        if (lVar7 == 0) break;
        pdVar4[lVar2 * lVar15 + lVar7] = 0.0;
        bVar3 = true;
        lVar14 = 0;
        lVar7 = lVar15;
      }
      else if (il == lVar15) {
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::splitOffTwoRows
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,lVar7,
                   SUB41(local_bc,0),&local_c8);
        lVar7 = lVar7 + -2;
        bVar3 = true;
        lVar14 = 0;
        dVar21 = local_b8;
      }
      else {
        local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 0.0;
        local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = 0.0;
        local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = 0.0;
        dVar19 = pdVar4[lVar2 * lVar7 + lVar7];
        lVar8 = lVar2 * lVar15;
        dVar20 = pdVar4[lVar8 + lVar7 + -1];
        dVar23 = pdVar4[lVar8 + lVar7] * pdVar4[lVar2 * lVar7 + lVar7 + -1];
        if (lVar14 == 0x1e) {
          dVar22 = (dVar20 - dVar19) * 0.5;
          dVar18 = dVar22 * dVar22 + dVar23;
          if (0.0 < dVar18) {
            if (dVar18 < 0.0) {
              uStack_40 = 0;
              uStack_50 = 0;
              uStack_60 = 0;
              uStack_70 = 0;
              local_90 = lVar6;
              local_88 = lVar14;
              local_78 = dVar22;
              local_68 = dVar20;
              local_58 = dVar19;
              local_48 = dVar23;
              dVar18 = sqrt(dVar18);
              lVar6 = local_90;
              lVar14 = local_88;
              dVar19 = local_58;
              dVar21 = local_b8;
              dVar22 = local_78;
              dVar23 = local_48;
              dVar20 = local_68;
            }
            else {
              dVar18 = SQRT(dVar18);
            }
            dVar22 = dVar19 - dVar23 / (dVar22 + (double)(~-(ulong)(dVar20 < dVar19) & (ulong)dVar18
                                                         | (ulong)-dVar18 &
                                                           -(ulong)(dVar20 < dVar19)));
            local_c8 = local_c8 + dVar22;
            dVar23 = 0.964;
            dVar19 = 0.964;
            dVar20 = 0.964;
            if (-1 < lVar7) {
              pdVar4 = *(double **)this;
              lVar2 = *(long *)(this + 8);
              lVar8 = lVar7 + 1;
              do {
                *pdVar4 = *pdVar4 - dVar22;
                pdVar4 = pdVar4 + lVar2 + 1;
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
              dVar23 = 0.964;
              dVar19 = 0.964;
              dVar20 = 0.964;
            }
          }
        }
        else if (lVar14 == 10) {
          local_c8 = local_c8 + dVar19;
          if (-1 < lVar7) {
            lVar9 = lVar7 + 1;
            pdVar12 = pdVar4;
            do {
              *pdVar12 = *pdVar12 - dVar19;
              pdVar12 = pdVar12 + lVar2 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          dVar19 = ABS(pdVar4[lVar2 * (lVar7 + -2) + lVar7 + -1]) + ABS(pdVar4[lVar8 + lVar7]);
          dVar23 = dVar19 * -0.4375 * dVar19;
          dVar19 = dVar19 * 0.75;
          dVar20 = dVar19;
        }
        bVar3 = lVar13 < local_b0;
        if (lVar13 < local_b0) {
          lVar8 = lVar7 + -2;
          if (il <= lVar8) {
            lVar2 = *(long *)this;
            uVar10 = *(long *)(this + 8) * 8;
            uVar5 = uVar10 ^ 0xfffffffffffffff8;
            lVar15 = lVar15 * uVar10 + lVar6;
            if (lVar16 < 1) {
              lVar16 = 0;
            }
            lVar9 = uVar10 * lVar8 + lVar6 + -8;
            lVar11 = (lVar7 + -3) * uVar10 + lVar6 + -0x10;
            lVar6 = lVar8;
            do {
              dVar21 = *(double *)(lVar2 + -8 + lVar9);
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] = ((dVar19 - dVar21) * (dVar20 - dVar21) + -dVar23) /
                          *(double *)(lVar2 + lVar9) + *(double *)(lVar2 + -0x10 + lVar15);
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] = ((*(double *)(lVar2 + -8 + lVar15) - dVar21) - (dVar19 - dVar21)) -
                          (dVar20 - dVar21);
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] = *(double *)(lVar2 + lVar15);
              lVar8 = il;
              if (lVar16 == lVar6) break;
              pdVar4 = (double *)(lVar2 + lVar11);
              pdVar12 = (double *)(lVar2 + -8 + lVar11);
              pdVar1 = (double *)(lVar2 + -8 + lVar15);
              lVar9 = lVar9 + uVar5;
              lVar15 = lVar15 + uVar5;
              lVar11 = lVar11 + uVar5;
              lVar8 = lVar6;
              lVar6 = lVar6 + -1;
            } while (local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] * (ABS(*pdVar1) + ABS(dVar21) + ABS(*pdVar12)) *
                     2.220446049250313e-16 <=
                     ABS((ABS(local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2]) +
                         ABS(local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1])) * *pdVar4));
          }
          RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::performFrancisQRStep
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,il,lVar8,lVar7,
                     SUB41(local_bc,0),&local_a8,local_80);
          dVar21 = local_b8;
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 1;
      }
      if ((!bVar3) || (lVar7 < 0)) break;
    } while( true );
  }
  *(uint *)(this + 0x80) = (uint)(local_b0 < lVar13) * 2;
  this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
  this[0x85] = SUB41(local_c0,0);
  return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{
  using std::abs;

  m_matT = matrixH;
  m_workspaceVector.resize(m_matT.cols());
  if(computeU && !internal::is_same_dense(m_matU,matrixQ))
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();
  // sub-diagonal entries smaller than considerAsZero will be treated as zero.
  // We use eps^2 to enable more precision in small eigenvalues.
  Scalar considerAsZero = numext::maxi<Scalar>( norm * numext::abs2(NumTraits<Scalar>::epsilon()),
                                                (std::numeric_limits<Scalar>::min)() );

  if(norm!=Scalar(0))
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu,considerAsZero);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector = Vector3s::Zero(), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}